

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook>::disposeImpl
          (HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<capnp::MembranePolicy,_std::nullptr_t>::dispose
              ((Own<capnp::MembranePolicy,_std::nullptr_t> *)((long)pointer + 0x20));
    Own<capnp::RequestHook,_std::nullptr_t>::dispose
              ((Own<capnp::RequestHook,_std::nullptr_t> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x58);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }